

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportWriteProtection.cpp
# Opt level: O3

bool axl::spy::disableImportWriteProtection(void *module,ImportWriteProtectionBackup *backup)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  size_t __len;
  ulong uVar5;
  void *__addr;
  ulong uVar6;
  
  if ((g::getModule()::module == '\0') &&
     (iVar2 = __cxa_guard_acquire(&g::getModule()::module), iVar2 != 0)) {
    g::Module::Module((Module *)g::getModule()::module);
    __cxa_atexit(g::Module::~Module,g::getModule()::module,&__dso_handle);
    __cxa_guard_release(&g::getModule()::module);
  }
  if ((ulong)*(ushort *)((long)module + 0x2b8) != 0) {
    lVar1 = *(long *)((long)module + 0x2a8);
    lVar3 = 0;
    do {
      if (*(int *)(lVar1 + lVar3) == 0x6474e552) {
        uVar5 = *(long *)(lVar1 + 0x10 + lVar3) + *module;
        uVar6 = -g::getModule()::module._8_8_;
        lVar4 = g::getModule()::module._8_8_ + *(long *)(lVar1 + 0x28 + lVar3);
        __addr = (void *)(uVar5 & uVar6);
        backup->m_p = __addr;
        __len = ((lVar4 + uVar5) - 1 & uVar6) - (long)__addr;
        backup->m_size = __len;
        backup->field_2 =
             *(anon_union_4_2_2040755a_for_ImportWriteProtectionBackup_2 *)(lVar1 + 4 + lVar3);
        iVar2 = mprotect(__addr,__len,7);
        return iVar2 != -1;
      }
      lVar3 = lVar3 + 0x38;
    } while ((ulong)*(ushort *)((long)module + 0x2b8) * 0x38 - lVar3 != 0);
  }
  backup->m_p = (void *)0x0;
  backup->m_size = 0;
  (backup->field_2).m_flags = 0;
  return true;
}

Assistant:

bool
disableImportWriteProtection(
	void* module,
	ImportWriteProtectionBackup* backup
) {
	size_t pageSize = g::getModule()->getSystemInfo()->m_pageSize;

	link_map_full* linkMap = (link_map_full*)module;
	for (size_t i = 0; i < linkMap->l_phnum; i++) {
		const ElfW(Phdr)* phdr = &linkMap->l_phdr[i];
		if (phdr->p_type != PT_GNU_RELRO) // read-only-after-relocation (contains GOT)
			continue;

		size_t begin = linkMap->l_addr + phdr->p_vaddr;
		size_t end = begin + phdr->p_memsz;

		begin &= ~(pageSize - 1);
		end = (end + pageSize - 1) & ~(pageSize - 1);

		backup->m_p = (char*)begin;
		backup->m_size = end - begin;
		backup->m_flags = phdr->p_flags;

		int result = ::mprotect(backup->m_p, backup->m_size, PROT_READ | PROT_WRITE | PROT_EXEC);
		return result != -1;
	}

	// GOT not found, still OK

	backup->m_p = NULL;
	backup->m_size = 0;
	backup->m_flags = 0;
	return true;
}